

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test::TestBody
          (ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  AssertHelper local_230 [8];
  Message local_228 [8];
  shared_ptr<libcellml::Issue> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8 [8];
  unsigned_long local_1d0 [2];
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  AssertionResult local_1a0 [2];
  AssertHelper local_180 [8];
  Message local_178 [15];
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  string local_150 [32];
  string local_130 [32];
  AssertionResult local_110 [2];
  AssertHelper local_f0 [8];
  Message local_e8 [15];
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  Message local_c0 [8];
  unsigned_long local_b8 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  ImporterPtr importer;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"modelflattening/SN_to_cAMP/SN_to_cAMP.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  libcellml::Importer::create((bool)((char)&gtest_ar + '\b'));
  local_b8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_b8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a8,"size_t(0)","parser->errorCount()",local_b8 + 1,local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x775,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_d9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_110,local_d8,"model->hasUnresolvedImports()","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x776,pcVar3);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    std::__cxx11::string::~string((string *)local_110);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  peVar4 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"modelflattening/SN_to_cAMP",
             (allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  resourcePath(local_130);
  libcellml::Importer::resolveImports((shared_ptr *)peVar4,(string *)local_30);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_169 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_1a0,local_168,"model->hasUnresolvedImports()","true");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77a,pcVar3);
    testing::internal::AssertHelper::operator=(local_180,local_178);
    testing::internal::AssertHelper::~AssertHelper(local_180);
    std::__cxx11::string::~string((string *)local_1a0);
    testing::Message::~Message(local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::operator=
            ((shared_ptr<libcellml::Model> *)local_30,
             (shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  local_1d0[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  local_1d0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1c0,"size_t(1)","importer->errorCount()",local_1d0 + 1,
             local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Logger::error((ulong)&local_220);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_220);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[32],std::__cxx11::string>
            ((EqHelper<false> *)local_1f0,"\"The model is not fully defined.\"",
             "importer->error(0)->description()",(char (*) [32])"The model is not fully defined.",
             &local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77f,pcVar3);
    testing::internal::AssertHelper::operator=(local_230,local_228);
    testing::internal::AssertHelper::~AssertHelper(local_230);
    testing::Message::~Message(local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, modelWithCnUnitsNotDefinedInImportedComponent)
{
    auto parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("modelflattening/SN_to_cAMP/SN_to_cAMP.cellml"));
    auto importer = libcellml::Importer::create(false);

    EXPECT_EQ(size_t(0), parser->errorCount());
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("modelflattening/SN_to_cAMP"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ("The model is not fully defined.", importer->error(0)->description());
}